

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O0

void cert_expr_builder_add(CertExprBuilder *eb,char *wildcard)

{
  size_t sVar1;
  ptrlen toktext_00;
  _Bool _Var2;
  Token TVar3;
  char **ppcVar4;
  char *pcVar5;
  ptrlen pl_00;
  char *pcStack_50;
  Token tok;
  char *err;
  ptrlen toktext;
  ptrlen pl;
  ptrlen orig;
  char *wildcard_local;
  CertExprBuilder *eb_local;
  
  pl_00 = ptrlen_from_asciz(wildcard);
  pl.len = (size_t)pl_00.ptr;
  toktext.len = pl.len;
  orig.ptr = (void *)pl_00.len;
  TVar3 = lex((ptrlen *)&toktext.len,(ptrlen *)&err,&stack0xffffffffffffffb0);
  if ((((TVar3 == TOK_ATOM) && (err == (char *)pl.len)) && (toktext.ptr == orig.ptr)) &&
     (toktext_00.len = (size_t)toktext.ptr, toktext_00.ptr = err,
     _Var2 = atom_is_hostname_wc(toktext_00), _Var2)) {
    ppcVar4 = (char **)safegrowarray(eb->wcs,&eb->wcsize,8,eb->nwcs,1,false);
    eb->wcs = ppcVar4;
    pcVar5 = mkstr(pl_00);
    sVar1 = eb->nwcs;
    eb->nwcs = sVar1 + 1;
    eb->wcs[sVar1] = pcVar5;
  }
  else if (TVar3 == TOK_ERROR) {
    safefree(pcStack_50);
  }
  return;
}

Assistant:

void cert_expr_builder_add(CertExprBuilder *eb, const char *wildcard)
{
    /* Check this wildcard is lexically valid as an atom */
    ptrlen orig = ptrlen_from_asciz(wildcard), pl = orig;
    ptrlen toktext;
    char *err;
    Token tok = lex(&pl, &toktext, &err);
    if (!(tok == TOK_ATOM &&
          toktext.ptr == orig.ptr &&
          toktext.len == orig.len &&
          atom_is_hostname_wc(toktext))) {
        if (tok == TOK_ERROR)
            sfree(err);
        return;
    }

    sgrowarray(eb->wcs, eb->wcsize, eb->nwcs);
    eb->wcs[eb->nwcs++] = mkstr(orig);
}